

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<__gnu_cxx::__normal_iterator<mp::Solver::SuffixInfo_const*,std::vector<mp::Solver::SuffixInfo,std::allocator<mp::Solver::SuffixInfo>>>,__gnu_cxx::__normal_iterator<mp::Solver::SuffixInfo_const*,std::vector<mp::Solver::SuffixInfo,std::allocator<mp::Solver::SuffixInfo>>>>
          (internal *this,char *expected_expression,char *actual_expression,
          __normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
          *expected,
          __normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
          *actual)

{
  __normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
  *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar2;
  string local_60;
  string local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (expected->_M_current == actual->_M_current) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    PrintToString<__gnu_cxx::__normal_iterator<mp::Solver::SuffixInfo_const*,std::vector<mp::Solver::SuffixInfo,std::allocator<mp::Solver::SuffixInfo>>>>
              (&local_40,(testing *)expected,
               (__normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
                *)actual_expression);
    PrintToString<__gnu_cxx::__normal_iterator<mp::Solver::SuffixInfo_const*,std::vector<mp::Solver::SuffixInfo,std::allocator<mp::Solver::SuffixInfo>>>>
              (&local_60,(testing *)actual,value);
    AVar2 = EqFailure(this,expected_expression,actual_expression,&local_40,&local_60,false);
    sVar1 = AVar2.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      sVar1.ptr_ = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      sVar1.ptr_ = extraout_RDX_00;
    }
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}